

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O2

Aig_Man_t * Iso_ManFilterPos_old(Aig_Man_t *pAig,int fVerbose)

{
  int i;
  Vec_Ptr_t *p;
  Aig_Man_t *pAVar1;
  Vec_Int_t *pVVar2;
  Aig_Man_t *pAig1;
  Vec_Int_t *vPerm2_;
  int iVar3;
  int i_00;
  int local_5c;
  Vec_Ptr_t *local_58;
  Vec_Ptr_t *local_50;
  Vec_Int_t *local_48;
  int local_40;
  int local_3c;
  Aig_Man_t *local_38;
  
  iVar3 = pAig->nObjs[3] - pAig->nRegs;
  local_38 = pAig;
  local_58 = Vec_PtrAlloc(iVar3);
  p = Vec_PtrAlloc(iVar3);
  for (local_5c = 0; local_5c < iVar3; local_5c = local_5c + 1) {
    pAVar1 = Saig_ManDupCones(local_38,&local_5c,1);
    pVVar2 = Saig_ManFindIsoPerm(pAVar1,0);
    Vec_PtrPush(local_58,pAVar1);
    Vec_PtrPush(p,pVVar2);
  }
  local_50 = Vec_PtrAlloc(1000);
  local_48 = Vec_IntAlloc(1000);
  local_40 = local_58->nSize;
  local_5c = 0;
  do {
    iVar3 = local_40;
    if (local_40 <= local_5c) {
      for (local_5c = 0; local_5c < iVar3; local_5c = local_5c + 1) {
        pAVar1 = (Aig_Man_t *)Vec_PtrEntry(local_58,local_5c);
        Aig_ManStop(pAVar1);
      }
      Vec_PtrFree(local_58);
      iVar3 = p->nSize;
      for (local_5c = 0; local_5c < iVar3; local_5c = local_5c + 1) {
        pVVar2 = (Vec_Int_t *)Vec_PtrEntry(p,local_5c);
        Vec_IntFree(pVVar2);
      }
      Vec_PtrFree(p);
      pVVar2 = local_48;
      pAVar1 = Saig_ManDupCones(local_38,local_48->pArray,local_48->nSize);
      Vec_PtrFree(local_50);
      Vec_IntFree(pVVar2);
      return pAVar1;
    }
    pAVar1 = (Aig_Man_t *)Vec_PtrEntry(local_58,local_5c);
    local_3c = local_50->nSize;
    i_00 = 0;
    iVar3 = 0;
    if (0 < local_3c) {
      iVar3 = local_3c;
    }
    for (; iVar3 != i_00; i_00 = i_00 + 1) {
      pAig1 = (Aig_Man_t *)Vec_PtrEntry(local_50,i_00);
      i = Vec_IntEntry(local_48,i_00);
      pVVar2 = (Vec_Int_t *)Vec_PtrEntry(p,i);
      vPerm2_ = (Vec_Int_t *)Vec_PtrEntry(p,local_5c);
      pVVar2 = Iso_ManFindMapping(pAig1,pAVar1,pVVar2,vPerm2_,0);
      if (pVVar2 != (Vec_Int_t *)0x0) {
        Vec_IntFree(pVVar2);
        iVar3 = i_00;
        break;
      }
    }
    if (iVar3 == local_3c) {
      Vec_PtrPush(local_50,pAVar1);
      Vec_IntPush(local_48,local_5c);
    }
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Iso_ManFilterPos_old( Aig_Man_t * pAig, int fVerbose )
{
    int fVeryVerbose = 0;
    Vec_Ptr_t * vParts, * vPerms, * vAigs;
    Vec_Int_t * vPos, * vMap;
    Aig_Man_t * pPart, * pTemp;
    int i, k, nPos;

    // derive AIG for each PO
    nPos = Aig_ManCoNum(pAig) - Aig_ManRegNum(pAig);
    vParts = Vec_PtrAlloc( nPos );
    vPerms = Vec_PtrAlloc( nPos );
    for ( i = 0; i < nPos; i++ )
    {
        pPart = Saig_ManDupCones( pAig, &i, 1 );
        vMap  = Saig_ManFindIsoPerm( pPart, fVeryVerbose );
        Vec_PtrPush( vParts, pPart ); 
        Vec_PtrPush( vPerms, vMap );
    }
//    s_Counter = 0;

    // check AIGs for each PO
    vAigs = Vec_PtrAlloc( 1000 );
    vPos  = Vec_IntAlloc( 1000 );
    Vec_PtrForEachEntry( Aig_Man_t *, vParts, pPart, i )
    {
        if ( fVeryVerbose )
        {
            printf( "AIG %4d : ", i );
            Aig_ManPrintStats( pPart );
        }
        Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pTemp, k )
        {
            if ( fVeryVerbose )
                printf( "Comparing AIG %4d and AIG %4d.  ", Vec_IntEntry(vPos,k), i );
            vMap = Iso_ManFindMapping( pTemp, pPart, 
                (Vec_Int_t *)Vec_PtrEntry(vPerms, Vec_IntEntry(vPos,k)), 
                (Vec_Int_t *)Vec_PtrEntry(vPerms, i),
                fVeryVerbose );
            if ( vMap != NULL )
            {
                if ( fVeryVerbose )
                    printf( "Found match\n" );
//                if ( fVerbose )
//                    printf( "Found match for AIG %4d and AIG %4d.\n", Vec_IntEntry(vPos,k), i );
                Vec_IntFree( vMap );
                break;
            }
            if ( fVeryVerbose )
                printf( "No match.\n" );
        }
        if ( k == Vec_PtrSize(vAigs) )
        {
            Vec_PtrPush( vAigs, pPart );
            Vec_IntPush( vPos, i );
        }
    }
    // delete AIGs
    Vec_PtrForEachEntry( Aig_Man_t *, vParts, pPart, i )
        Aig_ManStop( pPart );
    Vec_PtrFree( vParts );
    Vec_PtrForEachEntry( Vec_Int_t *, vPerms, vMap, i )
        Vec_IntFree( vMap );
    Vec_PtrFree( vPerms );
    // derive the resulting AIG
    pPart = Saig_ManDupCones( pAig, Vec_IntArray(vPos), Vec_IntSize(vPos) );
    Vec_PtrFree( vAigs );
    Vec_IntFree( vPos );

//    printf( "The number of all checks %d.  Complex checks %d.\n", nPos*(nPos-1)/2, s_Counter );
    return pPart;
}